

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * __thiscall
gulps::message::print_message_abi_cxx11_(string *__return_storage_ptr__,message *this,bool inc_text)

{
  undefined7 in_register_00000011;
  long *args_6;
  char *local_60;
  string local_58;
  
  fmt::v5::localtime((v5 *)&local_58,(time_t *)this->time);
  args_6 = (long *)0x12be67;
  local_60 = level_to_str(this->lvl);
  fmt::v5::
  format<char[42],tm,char_const*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,long>
            (__return_storage_ptr__,(v5 *)"{:%Y-%m-%d %H:%M:%S} {} [{}] {}.{} {}:{} ",
             (char (*) [42])&local_58,(tm *)&local_60,(char **)&this->thread_id,&this->cat_major,
             &this->cat_minor,&this->src_path,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->src_line,
             args_6);
  if ((int)CONCAT71(in_register_00000011,inc_text) != 0) {
    print_text_abi_cxx11_(&local_58,this);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string print_message(bool inc_text = true) const
		{
			std::string out = fmt::format("{:%Y-%m-%d %H:%M:%S} {} [{}] {}.{} {}:{} ", fmt::localtime(time), 
					level_to_str(lvl), thread_id, cat_major, cat_minor, src_path, src_line);

			if(inc_text)
				out += print_text();

			return out;
		}